

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

Template * __thiscall
inja::Environment::parse(Template *__return_storage_ptr__,Environment *this,string_view input)

{
  string_view input_00;
  path local_1f0;
  size_t local_1c8;
  char *pcStack_1c0;
  undefined1 local_1b8 [8];
  Parser parser;
  Environment *this_local;
  string_view input_local;
  
  parser.block_statement_stack.c.
  super__Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  Parser::Parser((Parser *)local_1b8,&this->parser_config,&this->lexer_config,
                 &this->template_storage,&this->function_storage);
  local_1c8 = input._M_len;
  pcStack_1c0 = input._M_str;
  std::filesystem::__cxx11::path::path(&local_1f0,&this->input_path);
  input_00._M_str = pcStack_1c0;
  input_00._M_len = local_1c8;
  Parser::parse(__return_storage_ptr__,(Parser *)local_1b8,input_00,&local_1f0);
  std::filesystem::__cxx11::path::~path(&local_1f0);
  Parser::~Parser((Parser *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Template parse(std::string_view input) {
    Parser parser(parser_config, lexer_config, template_storage, function_storage);
    return parser.parse(input, input_path);
  }